

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeList
          (StringTree *__return_storage_ptr__,Impl *this,Array<kj::StringTree> *elements,
          bool hasMultilineElement,uint indent,bool *multiline,bool hasPrefix)

{
  ulong uVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree *pSVar4;
  undefined7 in_register_00000009;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_00000084;
  ArrayPtr<const_char> *params_2;
  ulong uVar7;
  ulong uVar8;
  ArrayDisposer *pAVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  StringPtr delim;
  String ownPrefix;
  String ownDelim;
  undefined8 *local_f8;
  char *local_f0;
  char *local_e0;
  char *local_d8;
  char *pcStack_d0;
  undefined8 *local_c8;
  StringTree local_98;
  bool *local_60;
  StringTree *local_58;
  ArrayPtr<const_char> local_50;
  char *local_40;
  ArrayDisposer *local_38;
  
  params_2 = (ArrayPtr<const_char> *)CONCAT44(in_register_00000084,indent);
  uVar1 = elements->size_;
  if (uVar1 == 0) {
    bVar14 = false;
  }
  else {
    lVar12 = 0;
    uVar7 = 0;
    do {
      uVar8 = *(ulong *)((long)&elements->ptr->size_ + lVar12);
      if (uVar8 < uVar7) {
        uVar8 = uVar7;
      }
      lVar12 = lVar12 + 0x38;
      uVar7 = uVar8;
    } while (uVar1 * 0x38 - lVar12 != 0);
    bVar14 = 0x32 < uVar8;
  }
  local_d8 = (char *)0x0;
  pcStack_d0 = (char *)0x0;
  local_c8 = (undefined8 *)0x0;
  pcVar6 = "";
  local_58 = __return_storage_ptr__;
  if (this->prettyPrint == true) {
    pcVar13 = (char *)0x3;
    pcVar10 = ", ";
    if (1 < uVar1) {
      local_f8 = (undefined8 *)0x0;
      pcVar11 = (char *)0x0;
      local_f0 = (char *)0x0;
      local_e0 = (char *)0x0;
      pcVar5 = "";
      pAVar9 = (ArrayDisposer *)0x0;
      local_60 = multiline;
      if (bVar14 || hasMultilineElement) {
        pcVar5 = (char *)(ulong)(indent * 2 + 2);
        local_40 = ",\n";
        local_38 = (ArrayDisposer *)0x2;
        local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,0x20);
        local_50.size_ = (size_t)pcVar5;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
                  ((String *)&local_98,(_ *)&local_40,&local_50,
                   (Repeat<char> *)CONCAT71(in_register_00000009,hasMultilineElement));
        pcVar11 = local_98.text.content.ptr;
        local_f8 = (undefined8 *)local_98.text.content.size_;
        local_f0 = (char *)local_98.size_;
        pcVar10 = (char *)local_98.size_;
        if (local_98.text.content.ptr == (char *)0x0) {
          pcVar10 = "";
        }
        pcVar13 = local_98.text.content.ptr + (local_98.text.content.ptr == (char *)0x0);
        *local_60 = true;
        local_e0 = (char *)0x1;
        pcVar6 = " ";
        if (hasPrefix) {
          local_40 = "\n";
          local_38 = (ArrayDisposer *)0x1;
          local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,0x20);
          local_50.size_ = (size_t)pcVar5;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
                    ((String *)&local_98,(_ *)&local_40,&local_50,(Repeat<char> *)0x1);
          local_d8 = (char *)local_98.size_;
          pcStack_d0 = local_98.text.content.ptr;
          pcVar5 = "";
          if (local_98.text.content.ptr != (char *)0x0) {
            pcVar5 = (char *)local_98.size_;
          }
          local_c8 = (undefined8 *)local_98.text.content.size_;
          pAVar9 = (ArrayDisposer *)
                   (local_98.text.content.ptr +
                   ((ulong)(local_98.text.content.ptr == (char *)0x0) - 1));
        }
        else {
          pcVar5 = " ";
          pAVar9 = (ArrayDisposer *)0x1;
        }
      }
      goto LAB_0017805a;
    }
  }
  else {
    pcVar13 = (char *)0x2;
    pcVar10 = ",";
  }
  local_f8 = (undefined8 *)0x0;
  pcVar11 = (char *)0x0;
  local_f0 = (char *)0x0;
  local_e0 = (char *)0x0;
  pcVar5 = "";
  pAVar9 = (ArrayDisposer *)0x0;
LAB_0017805a:
  delim.content.size_ = (size_t)pcVar13;
  delim.content.ptr = pcVar10;
  kj::StringTree::StringTree(&local_98,elements,delim);
  pSVar4 = local_58;
  local_50.size_ = (size_t)local_e0;
  local_50.ptr = pcVar6;
  local_40 = pcVar5;
  local_38 = pAVar9;
  kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (local_58,(StringTree *)&local_40,(ArrayPtr<const_char> *)&local_98,
             (StringTree *)&local_50,params_2);
  sVar2 = local_98.branches.size_;
  pBVar3 = local_98.branches.ptr;
  if (local_98.branches.ptr != (Branch *)0x0) {
    local_98.branches.ptr = (Branch *)0x0;
    local_98.branches.size_ = 0;
    (**(local_98.branches.disposer)->_vptr_ArrayDisposer)
              (local_98.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_98.text.content.size_;
  pcVar6 = local_98.text.content.ptr;
  if (local_98.text.content.ptr != (char *)0x0) {
    local_98.text.content.ptr = (char *)0x0;
    local_98.text.content.size_ = 0;
    (**(local_98.text.content.disposer)->_vptr_ArrayDisposer)
              (local_98.text.content.disposer,pcVar6,1,sVar2,sVar2,0);
  }
  if (local_f0 != (char *)0x0) {
    (**(code **)*local_f8)(local_f8,local_f0,1,pcVar11,pcVar11,0);
  }
  if (local_d8 != (char *)0x0) {
    (**(code **)*local_c8)(local_c8,local_d8,1,pcStack_d0,pcStack_d0,0);
  }
  return pSVar4;
}

Assistant:

kj::StringTree encodeList(kj::Array<kj::StringTree> elements,
                            bool hasMultilineElement, uint indent, bool& multiline,
                            bool hasPrefix) const {
    size_t maxChildSize = 0;
    for (auto& e: elements) maxChildSize = kj::max(maxChildSize, e.size());

    kj::StringPtr prefix;
    kj::StringPtr delim;
    kj::StringPtr suffix;
    kj::String ownPrefix;
    kj::String ownDelim;
    if (!prettyPrint) {
      // No whitespace.
      delim = ",";
      prefix = "";
      suffix = "";
    } else if ((elements.size() > 1) && (hasMultilineElement || maxChildSize > 50)) {
      // If the array contained any multi-line elements, OR it contained sufficiently long
      // elements, then put each element on its own line.
      auto indentSpace = kj::repeat(' ', (indent + 1) * 2);
      delim = ownDelim = kj::str(",\n", indentSpace);
      multiline = true;
      if (hasPrefix) {
        // We're producing a multi-line list, and the first line has some garbage in front of it.
        // Therefore, move the first element to the next line.
        prefix = ownPrefix = kj::str("\n", indentSpace);
      } else {
        prefix = " ";
      }
      suffix = " ";
    } else {
      // Put everything on one line, but add spacing between elements for legibility.
      delim = ", ";
      prefix = "";
      suffix = "";
    }

    return kj::strTree(prefix, kj::StringTree(kj::mv(elements), delim), suffix);
  }